

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void P_BringUpWeapon(player_t *player)

{
  double dVar1;
  AWeapon *pAVar2;
  AWeapon *pAVar3;
  APlayerPawn *ent;
  int iVar4;
  DPSprite *pDVar5;
  undefined4 extraout_var;
  AInventory *pAVar6;
  undefined4 extraout_var_00;
  AWeapon *pAVar7;
  FSoundID local_1c;
  
  pAVar2 = player->PendingWeapon;
  if (pAVar2 == (AWeapon *)0x0) goto LAB_00557d14;
  if (pAVar2 == (AWeapon *)0xffffffffffffffff) {
    if (player->ReadyWeapon == (AWeapon *)0x0) {
      return;
    }
    pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
    pDVar5->y = 32.375;
    iVar4 = (*(player->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
              _vptr_DObject[0x46])();
    pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
    DPSprite::SetState(pDVar5,(FState *)CONCAT44(extraout_var,iVar4),false);
    return;
  }
  pAVar3 = (pAVar2->SisterWeapon).field_0.p;
  pAVar7 = pAVar2;
  if (pAVar3 != (AWeapon *)0x0) {
    if (((pAVar3->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) ==
        0) {
      if ((((pAVar3->super_AInventory).field_0x4dd & 4) != 0) &&
         (pAVar6 = AActor::FindInventory
                             (&player->mo->super_AActor,
                              (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
         pAVar6 != (AInventory *)0x0)) {
        pAVar7 = (pAVar2->SisterWeapon).field_0.p;
        if (pAVar7 != (AWeapon *)0x0) {
          if (((pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
              0x20) == 0) goto LAB_00557d4a;
          (pAVar2->SisterWeapon).field_0.p = (AWeapon *)0x0;
        }
LAB_00557d14:
        player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
        player->ReadyWeapon = (AWeapon *)0x0;
        (player->mo->super_AActor).weaponspecial = 0;
        return;
      }
    }
    else {
      (pAVar2->SisterWeapon).field_0.p = (AWeapon *)0x0;
    }
  }
LAB_00557d4a:
  player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
  player->ReadyWeapon = pAVar7;
  ent = player->mo;
  (ent->super_AActor).weaponspecial = 0;
  iVar4 = (pAVar7->UpSound).super_FSoundID.ID;
  if (iVar4 != 0) {
    local_1c.ID = iVar4;
    S_Sound(&ent->super_AActor,1,&local_1c,1.0,1.0);
  }
  player->refire = 0;
  dVar1 = *(double *)(&DAT_00769020 + (ulong)(((uint)player->cheats >> 0xb & 1) == 0) * 8);
  pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
  pDVar5->y = dVar1;
  pDVar5 = player_t::GetPSprite(player,PSP_FLASH);
  DPSprite::SetState(pDVar5,(FState *)0x0,false);
  iVar4 = (*(pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x44]
          )(pAVar7);
  pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
  DPSprite::SetState(pDVar5,(FState *)CONCAT44(extraout_var_00,iVar4),false);
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}